

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O3

void __thiscall leveldb::AutoCompactTest::DoReads(AutoCompactTest *this,int n)

{
  DB *pDVar1;
  FILE *__stream;
  _Alloc_hider _Var2;
  size_type sVar3;
  AssertHelper AVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char cVar8;
  long *plVar9;
  Env *pEVar10;
  AutoCompactTest *pAVar11;
  uint uVar12;
  AssertHelper *this_00;
  _func_int **pp_Var13;
  long lVar14;
  string *message;
  int iVar15;
  undefined1 auVar16 [16];
  uint64_t size_2;
  int64_t final_other_size;
  string limit_key;
  uint64_t size;
  string value;
  undefined1 local_12d;
  uint local_12c;
  string local_128;
  AutoCompactTest *local_108;
  AssertHelper local_100;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  AutoCompactTest *pAStack_d0;
  undefined1 local_c0 [48];
  AutoCompactTest *pAStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  AutoCompactTest *pAStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  AutoCompactTest *pAStack_40;
  undefined4 extraout_var;
  
  local_78 = &local_68;
  local_c0._36_4_ = n;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\0');
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)this->db_;
  iVar15 = 0;
  local_108 = this;
  do {
    pDVar1 = local_108->db_;
    local_12d = 0;
    Key_abi_cxx11_(&local_128,local_108,iVar15);
    local_f8._M_dataplus._M_p = local_128._M_dataplus._M_p;
    local_f8._M_string_length = local_128._M_string_length;
    local_c0._40_8_ = local_78;
    pAStack_90 = pAStack_70;
    (*pDVar1->_vptr_DB[2])(&local_100,pDVar1,&local_12d,&local_f8,local_c0 + 0x28);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_c0,
               (char *)&local_12c,(Status *)"db_->Put(WriteOptions(), Key(i), value)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.data_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_100.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = local_c0._8_8_;
    if (local_c0[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_128);
      if ((AutoCompactTest *)local_c0._8_8_ == (AutoCompactTest *)0x0) {
        pp_Var13 = (_func_int **)0x15a7fa;
      }
      else {
        pp_Var13 = ((Test *)local_c0._8_8_)->_vptr_Test;
      }
      iVar15 = 0x41;
      goto LAB_0010b423;
    }
    if ((AutoCompactTest *)local_c0._8_8_ != (AutoCompactTest *)0x0) {
      pp_Var13 = ((Test *)local_c0._8_8_)->_vptr_Test;
      if ((string *)pp_Var13 != (string *)(local_c0._8_8_ + 0x10)) {
        operator_delete(pp_Var13);
      }
      operator_delete((void *)uVar5);
    }
    iVar15 = iVar15 + 1;
  } while (iVar15 != 0x200);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_c0);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_128,
             (char *)&local_f8,(Status *)"dbi->TEST_CompactMemTable()");
  if ((void *)CONCAT71(local_c0._1_7_,local_c0[0]) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_c0._1_7_,local_c0[0]));
  }
  sVar3 = local_128._M_string_length;
  if ((char)local_128._M_dataplus._M_p != '\0') {
    if ((AutoCompactTest *)local_128._M_string_length != (AutoCompactTest *)0x0) {
      pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
      if ((string *)pp_Var13 != (string *)(local_128._M_string_length + 0x10)) {
        operator_delete(pp_Var13);
      }
      operator_delete((void *)sVar3);
    }
    iVar15 = 0;
LAB_0010adb8:
    pDVar1 = local_108->db_;
    local_12c = local_12c & 0xffffff00;
    Key_abi_cxx11_(&local_128,local_108,iVar15);
    local_f8._M_dataplus._M_p = local_128._M_dataplus._M_p;
    local_f8._M_string_length = local_128._M_string_length;
    (*pDVar1->_vptr_DB[3])(local_c0 + 0x28,pDVar1,&local_12c,&local_f8);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_c0,
               (char *)&local_100,(Status *)"db_->Delete(WriteOptions(), Key(i))");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._40_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__((void *)local_c0._40_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    uVar5 = local_c0._8_8_;
    if (local_c0[0] != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0)
    goto code_r0x0010ae38;
    testing::Message::Message((Message *)&local_128);
    if ((AutoCompactTest *)local_c0._8_8_ == (AutoCompactTest *)0x0) {
      pp_Var13 = (_func_int **)0x15a7fa;
    }
    else {
      pp_Var13 = ((Test *)local_c0._8_8_)->_vptr_Test;
    }
    iVar15 = 0x47;
LAB_0010b423:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
               ,iVar15,(char *)pp_Var13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    pAVar11 = (AutoCompactTest *)local_c0._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 8))();
      pAVar11 = (AutoCompactTest *)local_c0._8_8_;
    }
    goto LAB_0010b4cb;
  }
  testing::Message::Message((Message *)local_c0);
  if ((AutoCompactTest *)local_128._M_string_length == (AutoCompactTest *)0x0) {
    pp_Var13 = (_func_int **)0x15a7fa;
  }
  else {
    pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
  }
  iVar15 = 0x43;
LAB_0010b49b:
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_f8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
             ,iVar15,(char *)pp_Var13);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
  pAVar11 = (AutoCompactTest *)local_128._M_string_length;
  if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_c0._1_7_,local_c0[0]) + 8))();
    pAVar11 = (AutoCompactTest *)local_128._M_string_length;
  }
LAB_0010b4cb:
  if (pAVar11 != (AutoCompactTest *)0x0) {
    pp_Var13 = (pAVar11->super_Test)._vptr_Test;
    if ((string *)pp_Var13 != &pAVar11->dbname_) {
      operator_delete(pp_Var13);
    }
    operator_delete(pAVar11);
  }
LAB_0010b4f1:
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return;
code_r0x0010ae38:
  if ((AutoCompactTest *)local_c0._8_8_ != (AutoCompactTest *)0x0) {
    pp_Var13 = ((Test *)local_c0._8_8_)->_vptr_Test;
    if ((string *)pp_Var13 != (string *)(local_c0._8_8_ + 0x10)) {
      operator_delete(pp_Var13);
    }
    operator_delete((void *)uVar5);
  }
  iVar15 = iVar15 + 1;
  if (iVar15 == 0x200) goto code_r0x0010ae6e;
  goto LAB_0010adb8;
code_r0x0010ae6e:
  DBImpl::TEST_CompactMemTable((DBImpl *)local_c0);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_128,
             (char *)&local_f8,(Status *)"dbi->TEST_CompactMemTable()");
  if ((void *)CONCAT71(local_c0._1_7_,local_c0[0]) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_c0._1_7_,local_c0[0]));
  }
  uVar6 = local_c0._36_4_;
  if ((char)local_128._M_dataplus._M_p != '\0') {
    if ((AutoCompactTest *)local_128._M_string_length != (AutoCompactTest *)0x0) {
      pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
      if ((string *)pp_Var13 != (string *)(local_128._M_string_length + 0x10)) {
        operator_delete(pp_Var13);
      }
      operator_delete((void *)local_128._M_string_length);
    }
    pAVar11 = local_108;
    Key_abi_cxx11_((string *)local_c0,local_108,0);
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT71(local_c0._1_7_,local_c0[0]);
    pAStack_d0 = (AutoCompactTest *)local_c0._8_8_;
    Key_abi_cxx11_(&local_f8,pAVar11,uVar6);
    local_128._M_dataplus._M_p = (pointer)local_d8;
    local_128._M_string_length = (size_type)pAStack_d0;
    local_128.field_2._M_allocated_capacity = (size_type)local_f8._M_dataplus._M_p;
    local_128.field_2._8_8_ = local_f8._M_string_length;
    pDVar1 = pAVar11->db_;
    (*pDVar1->_vptr_DB[10])(pDVar1,&local_128,1,local_c0 + 0x28);
    uVar5 = local_c0._40_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_c0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]));
    }
    pAVar11 = local_108;
    Key_abi_cxx11_((string *)local_c0,local_108,uVar6);
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT71(local_c0._1_7_,local_c0[0]);
    pAStack_d0 = (AutoCompactTest *)local_c0._8_8_;
    Key_abi_cxx11_(&local_f8,pAVar11,0x200);
    local_128._M_dataplus._M_p = (pointer)local_d8;
    local_128._M_string_length = (size_type)pAStack_d0;
    local_128.field_2._M_allocated_capacity = (size_type)local_f8._M_dataplus._M_p;
    local_128.field_2._8_8_ = local_f8._M_string_length;
    pDVar1 = pAVar11->db_;
    (*pDVar1->_vptr_DB[10])(pDVar1,&local_128,1,local_c0 + 0x28);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c0._40_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_c0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]));
    }
    Key_abi_cxx11_((string *)local_c0,local_108,uVar6);
    local_12c = 0;
    local_f8._M_dataplus._M_p._0_4_ = 100;
    testing::internal::CmpHelperLT<int,int>
              ((internal *)&local_128,"read","100",(int *)&local_12c,(int *)&local_f8);
    if ((char)local_128._M_dataplus._M_p == '\x01') {
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)uVar5 / 10);
      do {
        if ((AutoCompactTest *)local_128._M_string_length != (AutoCompactTest *)0x0) {
          DoReads((AutoCompactTest *)local_128._M_string_length);
        }
        local_128._M_string_length = 0;
        local_128._M_dataplus._M_p = (pointer)0x100;
        iVar15 = (*local_108->db_->_vptr_DB[6])(local_108->db_,&local_128);
        plVar9 = (long *)CONCAT44(extraout_var,iVar15);
        (**(code **)(*plVar9 + 0x18))(plVar9);
        while (cVar8 = (**(code **)(*plVar9 + 0x10))(plVar9), cVar8 != '\0') {
          auVar16 = (**(code **)(*plVar9 + 0x40))(plVar9);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,auVar16._0_8_,auVar16._8_8_ + auVar16._0_8_);
          uVar5 = local_c0._8_8_;
          sVar3 = local_128._M_string_length;
          _Var2._M_p = local_128._M_dataplus._M_p;
          pAVar11 = (AutoCompactTest *)local_128._M_string_length;
          if ((ulong)local_c0._8_8_ < local_128._M_string_length) {
            pAVar11 = (AutoCompactTest *)local_c0._8_8_;
          }
          if ((pAVar11 == (AutoCompactTest *)0x0) ||
             (iVar15 = memcmp(local_128._M_dataplus._M_p,
                              (void *)CONCAT71(local_c0._1_7_,local_c0[0]),(size_t)pAVar11),
             iVar15 == 0)) {
            lVar14 = sVar3 - uVar5;
            if (lVar14 < -0x7fffffff) {
              lVar14 = -0x80000000;
            }
            if (0x7ffffffe < lVar14) {
              lVar14 = 0x7fffffff;
            }
            iVar15 = (int)lVar14;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var2._M_p != &local_128.field_2) {
            operator_delete(_Var2._M_p);
          }
          if (-1 < iVar15) break;
          (**(code **)(*plVar9 + 0x30))(plVar9);
        }
        (**(code **)(*plVar9 + 8))(plVar9);
        pEVar10 = Env::Default();
        (*pEVar10->_vptr_Env[0x16])(pEVar10,1000000);
        pAVar11 = local_108;
        Key_abi_cxx11_(&local_f8,local_108,0);
        uVar6 = local_c0._36_4_;
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_f8._M_dataplus._M_p;
        pAStack_d0 = (AutoCompactTest *)local_f8._M_string_length;
        Key_abi_cxx11_((string *)(local_c0 + 0x28),pAVar11,local_c0._36_4_);
        local_128._M_dataplus._M_p = (pointer)local_d8;
        local_128._M_string_length = (size_type)pAStack_d0;
        local_128.field_2._M_allocated_capacity = local_c0._40_8_;
        local_128.field_2._8_8_ = pAStack_90;
        pDVar1 = pAVar11->db_;
        (*pDVar1->_vptr_DB[10])(pDVar1,&local_128,1,&local_100);
        AVar4.data_ = local_100.data_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._40_8_ != &local_88) {
          operator_delete((void *)local_c0._40_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        pAVar11 = local_108;
        __stream = _stderr;
        uVar12 = local_12c + 1;
        auVar16._8_4_ = (int)((ulong)AVar4.data_ >> 0x20);
        auVar16._0_8_ = AVar4.data_;
        auVar16._12_4_ = 0x45300000;
        pAStack_d0 = (AutoCompactTest *)(auVar16._8_8_ - 1.9342813113834067e+25);
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(((double)pAStack_d0 +
                       ((double)CONCAT44(0x43300000,(int)AVar4.data_) - 4503599627370496.0)) *
                      9.5367431640625e-07);
        Key_abi_cxx11_(&local_f8,local_108,uVar6);
        local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_f8._M_dataplus._M_p;
        pAStack_40 = (AutoCompactTest *)local_f8._M_string_length;
        Key_abi_cxx11_((string *)(local_c0 + 0x28),pAVar11,0x200);
        local_128._M_dataplus._M_p = (pointer)local_48;
        local_128._M_string_length = (size_type)pAStack_40;
        local_128.field_2._M_allocated_capacity = local_c0._40_8_;
        local_128.field_2._8_8_ = pAStack_90;
        pDVar1 = pAVar11->db_;
        (*pDVar1->_vptr_DB[10])(pDVar1,&local_128,1,&local_100);
        fprintf(__stream,"iter %3d => %7.3f MB [other %7.3f MB]\n",(ulong)uVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._40_8_ != &local_88) {
          operator_delete((void *)local_c0._40_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        pAVar11 = local_108;
        if (AVar4.data_ <= local_50) {
          Key_abi_cxx11_(&local_f8,local_108,uVar6);
          local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_f8._M_dataplus._M_p;
          pAStack_d0 = (AutoCompactTest *)local_f8._M_string_length;
          Key_abi_cxx11_((string *)(local_c0 + 0x28),pAVar11,0x200);
          local_128._M_dataplus._M_p = (pointer)local_d8;
          local_128._M_string_length = (size_type)pAStack_d0;
          local_128.field_2._M_allocated_capacity = local_c0._40_8_;
          local_128.field_2._8_8_ = pAStack_90;
          pDVar1 = pAVar11->db_;
          (*pDVar1->_vptr_DB[10])(pDVar1,&local_128,1,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._40_8_ != &local_88) {
            operator_delete((void *)local_c0._40_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          paVar7 = local_58;
          local_f8._M_dataplus._M_p = (pointer)local_100.data_;
          local_c0._40_8_ = &local_58->_M_allocated_capacity + 0x20000;
          testing::internal::CmpHelperLE<long,long>
                    ((internal *)&local_128,"final_other_size","initial_other_size + 1048576",
                     (long *)&local_f8,(long *)(local_c0 + 0x28));
          sVar3 = local_128._M_string_length;
          if ((char)local_128._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)(local_c0 + 0x28));
            if ((AutoCompactTest *)local_128._M_string_length == (AutoCompactTest *)0x0) {
              pp_Var13 = (_func_int **)0x15a7fa;
            }
            else {
              pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
            }
            iVar15 = 0x66;
          }
          else {
            if ((AutoCompactTest *)local_128._M_string_length != (AutoCompactTest *)0x0) {
              pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
              if ((string *)pp_Var13 != (string *)(local_128._M_string_length + 0x10)) {
                operator_delete(pp_Var13);
              }
              operator_delete((void *)sVar3);
            }
            local_c0._40_8_ = (long)paVar7 / 5 + -0x100000;
            testing::internal::CmpHelperGE<long,long>
                      ((internal *)&local_128,"final_other_size","initial_other_size / 5 - 1048576",
                       (long *)&local_f8,(long *)(local_c0 + 0x28));
            if ((char)local_128._M_dataplus._M_p != '\0') goto LAB_0010b5c6;
            testing::Message::Message((Message *)(local_c0 + 0x28));
            if ((AutoCompactTest *)local_128._M_string_length == (AutoCompactTest *)0x0) {
              pp_Var13 = (_func_int **)0x15a7fa;
            }
            else {
              pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
            }
            iVar15 = 0x67;
          }
          this_00 = &local_100;
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
                     ,iVar15,(char *)pp_Var13);
          message = (string *)(local_c0 + 0x28);
          goto LAB_0010b5a5;
        }
        local_12c = local_12c + 1;
        local_f8._M_dataplus._M_p._0_4_ = 100;
        testing::internal::CmpHelperLT<int,int>
                  ((internal *)&local_128,"read","100",(int *)&local_12c,(int *)&local_f8);
      } while ((char)local_128._M_dataplus._M_p != '\0');
    }
    testing::Message::Message((Message *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f8._M_dataplus._M_p + 0x10),"Taking too long to compact",0x1a);
    if ((AutoCompactTest *)local_128._M_string_length == (AutoCompactTest *)0x0) {
      pp_Var13 = (_func_int **)0x15a7fa;
    }
    else {
      pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
    }
    this_00 = (AssertHelper *)(local_c0 + 0x28);
    testing::internal::AssertHelper::AssertHelper
              (this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
               ,0x52,(char *)pp_Var13);
    message = &local_f8;
LAB_0010b5a5:
    testing::internal::AssertHelper::operator=(this_00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    plVar9 = (long *)(message->_M_dataplus)._M_p;
    if (plVar9 != (long *)0x0) {
      (**(code **)(*plVar9 + 8))();
    }
LAB_0010b5c6:
    sVar3 = local_128._M_string_length;
    if ((AutoCompactTest *)local_128._M_string_length != (AutoCompactTest *)0x0) {
      pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
      if ((string *)pp_Var13 != (string *)(local_128._M_string_length + 0x10)) {
        operator_delete(pp_Var13);
      }
      operator_delete((void *)sVar3);
    }
    if ((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_c0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]));
    }
    goto LAB_0010b4f1;
  }
  testing::Message::Message((Message *)local_c0);
  if ((AutoCompactTest *)local_128._M_string_length == (AutoCompactTest *)0x0) {
    pp_Var13 = (_func_int **)0x15a7fa;
  }
  else {
    pp_Var13 = ((Test *)local_128._M_string_length)->_vptr_Test;
  }
  iVar15 = 0x49;
  goto LAB_0010b49b;
}

Assistant:

void AutoCompactTest::DoReads(int n) {
  std::string value(kValueSize, 'x');
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);

  // Fill database
  for (int i = 0; i < kCount; i++) {
    ASSERT_LEVELDB_OK(db_->Put(WriteOptions(), Key(i), value));
  }
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  // Delete everything
  for (int i = 0; i < kCount; i++) {
    ASSERT_LEVELDB_OK(db_->Delete(WriteOptions(), Key(i)));
  }
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  // Get initial measurement of the space we will be reading.
  const int64_t initial_size = Size(Key(0), Key(n));
  const int64_t initial_other_size = Size(Key(n), Key(kCount));

  // Read until size drops significantly.
  std::string limit_key = Key(n);
  for (int read = 0; true; read++) {
    ASSERT_LT(read, 100) << "Taking too long to compact";
    Iterator* iter = db_->NewIterator(ReadOptions());
    for (iter->SeekToFirst();
         iter->Valid() && iter->key().ToString() < limit_key; iter->Next()) {
      // Drop data
    }
    delete iter;
    // Wait a little bit to allow any triggered compactions to complete.
    Env::Default()->SleepForMicroseconds(1000000);
    uint64_t size = Size(Key(0), Key(n));
    std::fprintf(stderr, "iter %3d => %7.3f MB [other %7.3f MB]\n", read + 1,
                 size / 1048576.0, Size(Key(n), Key(kCount)) / 1048576.0);
    if (size <= initial_size / 10) {
      break;
    }
  }

  // Verify that the size of the key space not touched by the reads
  // is pretty much unchanged.
  const int64_t final_other_size = Size(Key(n), Key(kCount));
  ASSERT_LE(final_other_size, initial_other_size + 1048576);
  ASSERT_GE(final_other_size, initial_other_size / 5 - 1048576);
}